

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::iuUniversalPrinter<unsigned_long[10]>::Print
               (unsigned_long (*a) [10],iu_ostream *os)

{
  size_t i;
  long lVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  lVar1 = 1;
  do {
    std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)os);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 10);
  std::__ostream_insert<char,std::char_traits<char>>(os," }",2);
  return;
}

Assistant:

static void Print(const T(&a)[SIZE], iu_ostream* os)
    {
        UniversalPrintArray(a, SIZE, os);
    }